

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Adjuster.cxx
# Opt level: O3

void __thiscall Fl_Adjuster::draw(Fl_Adjuster *this)

{
  int iVar1;
  Fl_Color c;
  Fl_Boxtype FVar2;
  int iVar3;
  int iVar4;
  int W;
  int iVar5;
  int H;
  
  W = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  H = (this->super_Fl_Valuator).super_Fl_Widget.h_;
  if (W < H) {
    H = H / 3;
    iVar4 = 0;
    iVar3 = H;
  }
  else {
    W = W / 3;
    iVar3 = 0;
    iVar4 = W;
  }
  FVar2 = (Fl_Boxtype)(this->super_Fl_Valuator).super_Fl_Widget.box_;
  if (*(int *)&(this->super_Fl_Valuator).field_0xa4 == 1) {
    FVar2 = FL_DOWN_BOX;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,FVar2,(this->super_Fl_Valuator).super_Fl_Widget.x_,
                      (this->super_Fl_Valuator).super_Fl_Widget.y_ + iVar3 * 2,W,H,
                      (this->super_Fl_Valuator).super_Fl_Widget.color_);
  FVar2 = (Fl_Boxtype)(this->super_Fl_Valuator).super_Fl_Widget.box_;
  if (*(int *)&(this->super_Fl_Valuator).field_0xa4 == 2) {
    FVar2 = FL_DOWN_BOX;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,FVar2,(this->super_Fl_Valuator).super_Fl_Widget.x_ + iVar4,
                      (this->super_Fl_Valuator).super_Fl_Widget.y_ + iVar3,W,H,
                      (this->super_Fl_Valuator).super_Fl_Widget.color_);
  FVar2 = (Fl_Boxtype)(this->super_Fl_Valuator).super_Fl_Widget.box_;
  if (*(int *)&(this->super_Fl_Valuator).field_0xa4 == 3) {
    FVar2 = FL_DOWN_BOX;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,FVar2,
                      (this->super_Fl_Valuator).super_Fl_Widget.x_ + iVar4 * 2,
                      (this->super_Fl_Valuator).super_Fl_Widget.y_,W,H,
                      (this->super_Fl_Valuator).super_Fl_Widget.color_);
  iVar1 = Fl_Widget::active_r((Fl_Widget *)this);
  c = (this->super_Fl_Valuator).super_Fl_Widget.color2_;
  if (iVar1 == 0) {
    c = fl_inactive(c);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)c);
  iVar1 = (W - (W + -0x10 >> 0x1f)) + -0x10 >> 1;
  iVar5 = (H - (H + -0x10 >> 0x1f)) + -0x10 >> 1;
  Fl_Bitmap::draw(&fastarrow,(this->super_Fl_Valuator).super_Fl_Widget.x_ + iVar1,
                  iVar3 * 2 + iVar5 + (this->super_Fl_Valuator).super_Fl_Widget.y_,W,H,0,0);
  Fl_Bitmap::draw(&mediumarrow,iVar4 + iVar1 + (this->super_Fl_Valuator).super_Fl_Widget.x_,
                  iVar3 + iVar5 + (this->super_Fl_Valuator).super_Fl_Widget.y_,W,H,0,0);
  Fl_Bitmap::draw(&slowarrow,iVar1 + iVar4 * 2 + (this->super_Fl_Valuator).super_Fl_Widget.x_,
                  iVar5 + (this->super_Fl_Valuator).super_Fl_Widget.y_,W,H,0,0);
  if ((Fl_Adjuster *)Fl::focus_ != this) {
    return;
  }
  Fl_Widget::draw_focus
            ((Fl_Widget *)this,(uint)(this->super_Fl_Valuator).super_Fl_Widget.box_,
             (this->super_Fl_Valuator).super_Fl_Widget.x_,
             (this->super_Fl_Valuator).super_Fl_Widget.y_,
             (this->super_Fl_Valuator).super_Fl_Widget.w_,
             (this->super_Fl_Valuator).super_Fl_Widget.h_);
  return;
}

Assistant:

void Fl_Adjuster::draw() {
  int dx, dy, W, H;
  if (w()>=h()) {
    dx = W = w()/3;
    dy = 0; H = h();
  } else {
    dx = 0; W = w();
    dy = H = h()/3;
  }
  draw_box(drag==1?FL_DOWN_BOX:box(), x(),  y()+2*dy, W, H, color());
  draw_box(drag==2?FL_DOWN_BOX:box(), x()+dx, y()+dy, W, H, color());
  draw_box(drag==3?FL_DOWN_BOX:box(), x()+2*dx,  y(), W, H, color());
  if (active_r())
    fl_color(selection_color());
  else
    fl_color(fl_inactive(selection_color()));
  fastarrow.draw(x()+(W-fastarrow_width)/2,
		 y()+2*dy+(H-fastarrow_height)/2, W, H);
  mediumarrow.draw(x()+dx+(W-mediumarrow_width)/2,
		   y()+dy+(H-mediumarrow_height)/2, W, H);
  slowarrow.draw(x()+2*dx+(W-slowarrow_width)/2,
		 y()+(H-slowarrow_width)/2, W, H);
  if (Fl::focus() == this) draw_focus();
}